

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_tables.cpp
# Opt level: O1

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn *column)

{
  uint uVar1;
  byte bVar2;
  
  if (column->SortOrder == -1) {
    bVar2 = column->SortDirectionsAvailList;
LAB_00155c8b:
    uVar1 = bVar2 & 3;
  }
  else {
    uVar1 = 1;
    bVar2 = 0;
    do {
      if ((column->SortDirectionsAvailList >> (bVar2 & 0x1f) & 3) == (column->field_0x65 & 3)) {
        bVar2 = column->SortDirectionsAvailList >>
                (char)(uVar1 % ((byte)column->field_0x65 >> 2 & 3)) * '\x02';
        goto LAB_00155c8b;
      }
      uVar1 = uVar1 + 1;
      bVar2 = bVar2 + 2;
    } while (uVar1 != 4);
    uVar1 = 0;
  }
  return uVar1;
}

Assistant:

ImGuiSortDirection ImGui::TableGetColumnNextSortDirection(ImGuiTableColumn* column)
{
    IM_ASSERT(column->SortDirectionsAvailCount > 0);
    if (column->SortOrder == -1)
        return TableGetColumnAvailSortDirection(column, 0);
    for (int n = 0; n < 3; n++)
        if (column->SortDirection == TableGetColumnAvailSortDirection(column, n))
            return TableGetColumnAvailSortDirection(column, (n + 1) % column->SortDirectionsAvailCount);
    IM_ASSERT(0);
    return ImGuiSortDirection_None;
}